

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicodeUtf8.c
# Opt level: O1

int decodeUtf8(uint8_t *bytePtr,uint32_t length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  uVar2 = (uint)*bytePtr;
  if (-1 < (char)*bytePtr) {
    return uVar2;
  }
  if ((uVar2 & 0xffffffe0) == 0xc0) {
    uVar3 = 1;
    uVar1 = 0x1f;
  }
  else if ((uVar2 & 0xfffffff0) == 0xe0) {
    uVar3 = 2;
    uVar1 = 0xf;
  }
  else {
    if ((uVar2 & 0xfffffff8) != 0xf0) {
      return -1;
    }
    uVar3 = 3;
    uVar1 = 7;
  }
  if (uVar3 <= length - 1) {
    uVar1 = uVar1 & uVar2;
    lVar4 = 0;
    do {
      if ((bytePtr[lVar4 + 1] & 0xffffffc0) != 0x80) {
        return -1;
      }
      uVar1 = uVar1 << 6 | bytePtr[lVar4 + 1] & 0x3f;
      lVar4 = lVar4 + 1;
    } while (uVar3 != (uint)lVar4);
    return uVar1;
  }
  return -1;
}

Assistant:

int decodeUtf8(const uint8_t *bytePtr, uint32_t length) {
    //若是1字节的ascii:  0xxxxxxx
    if (*bytePtr <= 0x7f) {
        return *bytePtr;
    }

    int value;
    uint32_t remainingBytes;

    // 先读取高1字节
    // 根据高字节的高n位判断相应字节数的utf8编码
    if ((*bytePtr & 0xe0) == 0xc0) {
        //若是2字节的utf8
        value = *bytePtr & 0x1f;
        remainingBytes = 1;
    } else if ((*bytePtr & 0xf0) == 0xe0) {
        // 若是3字节的utf8
        value = *bytePtr & 0x0f;
        remainingBytes = 2;
    } else if ((*bytePtr & 0xf8) == 0xf0) {
        // 若是4字节的utf8
        value = *bytePtr & 0x07;
        remainingBytes = 3;
    } else {   // 非法编码
        return -1;
    }

    // 如果utf8被斩断了就不再读过去了
    if (remainingBytes > length - 1) {
        return -1;
    }

    // 再读取低字节中的数据
    while (remainingBytes > 0) {
        bytePtr++;
        remainingBytes--;
        //高2位必须是10
        if ((*bytePtr & 0xc0) != 0x80) {
            return -1;
        }

        // 从次高字节往低字节,不断累加各字节的低6位
        value = value << 6 | (*bytePtr & 0x3f);
    }
    return value;
}